

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastqTest_CompressedFormatError_Test::
BioparserFastqTest_CompressedFormatError_Test(BioparserFastqTest_CompressedFormatError_Test *this)

{
  BioparserFastqTest_CompressedFormatError_Test *this_local;
  
  BioparserFastqTest::BioparserFastqTest(&this->super_BioparserFastqTest);
  (this->super_BioparserFastqTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserFastqTest_CompressedFormatError_Test_001a9dc8;
  return;
}

Assistant:

TEST_F(BioparserFastqTest, CompressedFormatError) {
  Setup("sample.fasta.gz");
  try {
    s = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::FastqParser] error: invalid file format");
  }
}